

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetKeyboardButton(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  optional<bool> oVar2;
  undefined8 *puVar3;
  self_type *psVar4;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Ptr PVar6;
  path_type local_80;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  *(undefined8 *)this = 0;
  puVar3 = (undefined8 *)operator_new(0x38);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_002aa8b8;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[2] = puVar3 + 4;
  puVar3[3] = 0;
  *(undefined1 *)(puVar3 + 4) = 0;
  *(undefined2 *)(puVar3 + 6) = 0;
  *(undefined8 **)(this + 8) = puVar3;
  *(string **)this = (string *)(puVar3 + 2);
  paVar1 = &local_80.m_value.field_2;
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"text","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  psVar4 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_80);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_50,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar4);
  std::__cxx11::string::operator=((string *)(puVar3 + 2),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"request_contact","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  oVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<bool>(in_RDX,&local_80);
  *(byte *)(puVar3 + 6) = oVar2.super_type.m_storage & oVar2.super_type.m_initialized & 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"request_location","");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  oVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<bool>(in_RDX,&local_80);
  *(byte *)((long)puVar3 + 0x31) = oVar2.super_type.m_storage & oVar2.super_type.m_initialized & 1;
  _Var5._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX_00;
  }
  PVar6.super___shared_ptr<TgBot::KeyboardButton,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  PVar6.super___shared_ptr<TgBot::KeyboardButton,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar6.super___shared_ptr<TgBot::KeyboardButton,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

KeyboardButton::Ptr TgTypeParser::parseJsonAndGetKeyboardButton(const boost::property_tree::ptree& data) const {
    auto result(make_shared<KeyboardButton>());
    result->text = data.get<string>("text");
    result->requestContact = data.get<bool>("request_contact", false);
    result->requestLocation = data.get<bool>("request_location", false);
    return result;
}